

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O2

void __thiscall
btSoftColliders::CollideCL_RS::ProcessColObj
          (CollideCL_RS *this,btSoftBody *ps,btCollisionObjectWrapper *colObWrap)

{
  float fVar1;
  btScalar bVar2;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar3;
  btVector3 maxs;
  btVector3 mins;
  btDbvtVolume volume;
  btDbvtAabbMm box;
  btVector3 local_98;
  btScalar local_88 [2];
  btScalar abStack_80 [2];
  btScalar local_78 [2];
  btScalar abStack_70 [2];
  btDbvtAabbMm local_68 [2];
  
  this->psb = ps;
  this->m_colObjWrap = colObWrap;
  (this->super_ClusterBase).idt = (ps->m_sst).isdt;
  (*colObWrap->m_shape->_vptr_btCollisionShape[0xc])();
  (*((this->psb->super_btCollisionObject).m_collisionShape)->_vptr_btCollisionShape[0xc])();
  (this->super_ClusterBase).m_margin = extraout_XMM0_Da_00 + extraout_XMM0_Da;
  fVar3 = (this->psb->m_cfg).kDF;
  fVar1 = this->m_colObjWrap->m_collisionObject->m_friction;
  if (fVar1 <= fVar3) {
    fVar3 = fVar1;
  }
  (this->super_ClusterBase).friction = fVar3;
  (*colObWrap->m_shape->_vptr_btCollisionShape[2])
            (colObWrap->m_shape,colObWrap->m_worldTransform,local_78,local_88);
  local_68[0].mi.m_floats[0] = local_78[0];
  local_68[0].mi.m_floats[1] = local_78[1];
  local_68[0].mi.m_floats[2] = abStack_70[0];
  local_68[0].mi.m_floats[3] = abStack_70[1];
  local_68[0].mx.m_floats[0] = local_88[0];
  local_68[0].mx.m_floats[1] = local_88[1];
  local_68[0].mx.m_floats[2] = abStack_80[0];
  local_68[0].mx.m_floats[3] = abStack_80[1];
  bVar2 = (this->super_ClusterBase).m_margin;
  local_98.m_floats[1] = bVar2;
  local_98.m_floats[0] = bVar2;
  local_98.m_floats[2] = bVar2;
  local_98.m_floats[3] = 0.0;
  btDbvtAabbMm::Expand(local_68,&local_98);
  btDbvt::collideTV(&ps->m_cdbvt,(ps->m_cdbvt).m_root,local_68,(ICollide *)this);
  return;
}

Assistant:

void		ProcessColObj(btSoftBody* ps,const btCollisionObjectWrapper* colObWrap)
		{
			psb			=	ps;
			m_colObjWrap			=	colObWrap;
			idt			=	ps->m_sst.isdt;
			m_margin		=	m_colObjWrap->getCollisionShape()->getMargin()+psb->getCollisionShape()->getMargin();
			///Bullet rigid body uses multiply instead of minimum to determine combined friction. Some customization would be useful.
			friction	=	btMin(psb->m_cfg.kDF,m_colObjWrap->getCollisionObject()->getFriction());
			btVector3			mins;
			btVector3			maxs;

			ATTRIBUTE_ALIGNED16(btDbvtVolume)		volume;
			colObWrap->getCollisionShape()->getAabb(colObWrap->getWorldTransform(),mins,maxs);
			volume=btDbvtVolume::FromMM(mins,maxs);
			volume.Expand(btVector3(1,1,1)*m_margin);
			ps->m_cdbvt.collideTV(ps->m_cdbvt.m_root,volume,*this);
		}